

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

BufferSp __thiscall
vkt::SpirVAssembly::createCompositeBuffer<float>(SpirVAssembly *this,float number)

{
  Buffer<float> *this_00;
  SharedPtrStateBase *extraout_RDX;
  BufferSp BVar1;
  allocator_type local_3d;
  float number_local;
  _Vector_base<float,_std::allocator<float>_> local_38;
  
  number_local = number;
  this_00 = (Buffer<float> *)operator_new(0x20);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_38,1,&number_local,&local_3d);
  Buffer<float>::Buffer(this_00,(vector<float,_std::allocator<float>_> *)&local_38);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
            ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)this,(BufferInterface *)this_00);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_38);
  BVar1.m_state = extraout_RDX;
  BVar1.m_ptr = (BufferInterface *)this;
  return BVar1;
}

Assistant:

BufferSp createCompositeBuffer(T number)
{
	return BufferSp(new Buffer<T>(vector<T>(1, number)));
}